

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cc
# Opt level: O0

Value * __thiscall flow::IRBuilder::createSub(IRBuilder *this,Value *lhs,Value *rhs,string *name)

{
  LiteralType LVar1;
  LiteralType LVar2;
  long lVar3;
  long lVar4;
  ConstantInt *pCVar5;
  ConstantValue<long,_(flow::LiteralType)2> *local_98;
  ConstantInt *local_88;
  string local_60;
  ConstantValue<long,_(flow::LiteralType)2> *local_40;
  ConstantInt *b;
  ConstantInt *a;
  string *name_local;
  Value *rhs_local;
  Value *lhs_local;
  IRBuilder *this_local;
  
  a = (ConstantInt *)name;
  name_local = (string *)rhs;
  rhs_local = lhs;
  lhs_local = (Value *)this;
  LVar1 = Value::type(lhs);
  LVar2 = Value::type((Value *)name_local);
  if (LVar1 != LVar2) {
    __assert_fail("lhs->type() == rhs->type()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/IRBuilder.cc"
                  ,0xc6,"Value *flow::IRBuilder::createSub(Value *, Value *, const std::string &)");
  }
  LVar1 = Value::type(rhs_local);
  if (LVar1 == Number) {
    if (rhs_local == (Value *)0x0) {
      local_88 = (ConstantInt *)0x0;
    }
    else {
      local_88 = (ConstantInt *)
                 __dynamic_cast(rhs_local,&Value::typeinfo,
                                &ConstantValue<long,(flow::LiteralType)2>::typeinfo,0);
    }
    b = local_88;
    if (local_88 != (ConstantInt *)0x0) {
      if (name_local == (string *)0x0) {
        local_98 = (ConstantValue<long,_(flow::LiteralType)2> *)0x0;
      }
      else {
        local_98 = (ConstantValue<long,_(flow::LiteralType)2> *)
                   __dynamic_cast(name_local,&Value::typeinfo,
                                  &ConstantValue<long,(flow::LiteralType)2>::typeinfo,0);
      }
      local_40 = local_98;
      if (local_98 != (ConstantValue<long,_(flow::LiteralType)2> *)0x0) {
        lVar3 = ConstantValue<long,_(flow::LiteralType)2>::get(b);
        lVar4 = ConstantValue<long,_(flow::LiteralType)2>::get(local_40);
        pCVar5 = get(this,lVar3 - lVar4);
        return (Value *)pCVar5;
      }
    }
    makeName(&local_60,this,(string *)a);
    this_local = (IRBuilder *)
                 insert<flow::BinaryInstr<(flow::BinaryOperator)1,(flow::LiteralType)2>,flow::Value*&,flow::Value*&,std::__cxx11::string>
                           (this,&rhs_local,(Value **)&name_local,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    return (Value *)this_local;
  }
  __assert_fail("lhs->type() == LiteralType::Number",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/IRBuilder.cc"
                ,199,"Value *flow::IRBuilder::createSub(Value *, Value *, const std::string &)");
}

Assistant:

Value* IRBuilder::createSub(Value* lhs, Value* rhs, const std::string& name) {
  assert(lhs->type() == rhs->type());
  assert(lhs->type() == LiteralType::Number);

  if (auto a = dynamic_cast<ConstantInt*>(lhs))
    if (auto b = dynamic_cast<ConstantInt*>(rhs))
      return get(a->get() - b->get());

  return insert<ISubInstr>(lhs, rhs, makeName(name));
}